

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int s_sha512_compress(sha512_state *md,uchar *buf)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long alStack_338 [6];
  ulong local_308 [8];
  ulong auStack_2c8 [83];
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_308[lVar1] = md->state[lVar1];
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar7 = *(ulong *)(buf + lVar1 * 8);
    auStack_2c8[lVar1 + 2] =
         uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
         (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  }
  for (lVar1 = 0x10; lVar1 != 0x50; lVar1 = lVar1 + 1) {
    uVar7 = auStack_2c8[lVar1];
    uVar2 = local_308[lVar1 + -5];
    auStack_2c8[lVar1 + 2] =
         (uVar7 >> 6 ^ (uVar7 << 3 | uVar7 >> 0x3d) ^ (uVar7 << 0x2d | uVar7 >> 0x13)) +
         local_308[lVar1 + 3] + alStack_338[lVar1] +
         (uVar2 >> 7 ^
         (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
  }
  for (uVar7 = 0; uVar7 < 0x50; uVar7 = uVar7 + 8) {
    lVar1 = ((local_308[4] << 0x17 | local_308[4] >> 0x29) ^
            (local_308[4] << 0x2e | local_308[4] >> 0x12) ^
            (local_308[4] << 0x32 | local_308[4] >> 0xe)) + local_308[7] + K[uVar7] +
            auStack_2c8[uVar7 + 2] + ((local_308[5] ^ local_308[6]) & local_308[4] ^ local_308[6]);
    uVar2 = local_308[3] + lVar1;
    lVar9 = ((local_308[5] ^ local_308[4]) & uVar2 ^ local_308[5]) + local_308[6] + K[uVar7 + 1] +
            ((uVar2 * 0x800000 | uVar2 >> 0x29) ^
            (uVar2 << 0x2e | uVar2 >> 0x12) ^ (uVar2 << 0x32 | uVar2 >> 0xe)) +
            auStack_2c8[uVar7 + 3];
    uVar10 = (local_308[1] & local_308[0] | (local_308[1] | local_308[0]) & local_308[2]) +
             ((local_308[0] << 0x19 | local_308[0] >> 0x27) ^
             (local_308[0] << 0x1e | local_308[0] >> 0x22) ^
             (local_308[0] << 0x24 | local_308[0] >> 0x1c)) + lVar1;
    uVar3 = local_308[2] + lVar9;
    uVar8 = (uVar10 & local_308[0] | (uVar10 | local_308[0]) & local_308[1]) +
            ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
            (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar9;
    lVar1 = local_308[5] + K[uVar7 + 2] + auStack_2c8[uVar7 + 4] +
            ((uVar2 ^ local_308[4]) & uVar3 ^ local_308[4]) +
            ((uVar3 * 0x800000 | uVar3 >> 0x29) ^
            (uVar3 << 0x2e | uVar3 >> 0x12) ^ (uVar3 << 0x32 | uVar3 >> 0xe));
    uVar4 = local_308[1] + lVar1;
    uVar5 = (uVar8 & uVar10 | (uVar8 | uVar10) & local_308[0]) +
            ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
            (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar1;
    lVar1 = local_308[4] + K[uVar7 + 3] + auStack_2c8[uVar7 + 5] + ((uVar3 ^ uVar2) & uVar4 ^ uVar2)
            + ((uVar4 * 0x800000 | uVar4 >> 0x29) ^
              (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe));
    uVar6 = local_308[0] + lVar1;
    uVar11 = (uVar5 & uVar8 | (uVar5 | uVar8) & uVar10) +
             ((uVar5 * 0x2000000 | uVar5 >> 0x27) ^
             (uVar5 * 0x40000000 | uVar5 >> 0x22) ^ (uVar5 << 0x24 | uVar5 >> 0x1c)) + lVar1;
    lVar1 = uVar2 + K[uVar7 + 4] + auStack_2c8[uVar7 + 6] + ((uVar4 ^ uVar3) & uVar6 ^ uVar3) +
            ((uVar6 * 0x800000 | uVar6 >> 0x29) ^
            (uVar6 << 0x2e | uVar6 >> 0x12) ^ (uVar6 << 0x32 | uVar6 >> 0xe));
    local_308[7] = uVar10 + lVar1;
    local_308[3] = lVar1 + (uVar11 & uVar5 | (uVar11 | uVar5) & uVar8) +
                           ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
                           (uVar11 * 0x40000000 | uVar11 >> 0x22) ^
                           (uVar11 << 0x24 | uVar11 >> 0x1c));
    lVar1 = uVar3 + K[uVar7 + 5] + auStack_2c8[uVar7 + 7] + ((uVar6 ^ uVar4) & local_308[7] ^ uVar4)
            + ((local_308[7] * 0x800000 | local_308[7] >> 0x29) ^
              (local_308[7] << 0x2e | local_308[7] >> 0x12) ^
              (local_308[7] << 0x32 | local_308[7] >> 0xe));
    local_308[6] = uVar8 + lVar1;
    local_308[2] = lVar1 + (local_308[3] & uVar11 | (local_308[3] | uVar11) & uVar5) +
                           ((local_308[3] * 0x2000000 | local_308[3] >> 0x27) ^
                           (local_308[3] * 0x40000000 | local_308[3] >> 0x22) ^
                           (local_308[3] << 0x24 | local_308[3] >> 0x1c));
    lVar1 = uVar4 + K[uVar7 + 6] + auStack_2c8[uVar7 + 8] +
            ((local_308[7] ^ uVar6) & local_308[6] ^ uVar6) +
            ((local_308[6] * 0x800000 | local_308[6] >> 0x29) ^
            (local_308[6] << 0x2e | local_308[6] >> 0x12) ^
            (local_308[6] << 0x32 | local_308[6] >> 0xe));
    local_308[5] = uVar5 + lVar1;
    local_308[1] = lVar1 + (local_308[2] & local_308[3] | (local_308[2] | local_308[3]) & uVar11) +
                           ((local_308[2] * 0x2000000 | local_308[2] >> 0x27) ^
                           (local_308[2] * 0x40000000 | local_308[2] >> 0x22) ^
                           (local_308[2] << 0x24 | local_308[2] >> 0x1c));
    lVar1 = uVar6 + K[uVar7 + 7] + auStack_2c8[uVar7 + 9] +
            ((local_308[6] ^ local_308[7]) & local_308[5] ^ local_308[7]) +
            ((local_308[5] * 0x800000 | local_308[5] >> 0x29) ^
            (local_308[5] << 0x2e | local_308[5] >> 0x12) ^
            (local_308[5] << 0x32 | local_308[5] >> 0xe));
    local_308[4] = uVar11 + lVar1;
    local_308[0] = lVar1 + (local_308[1] & local_308[2] |
                           (local_308[1] | local_308[2]) & local_308[3]) +
                           ((local_308[1] * 0x2000000 | local_308[1] >> 0x27) ^
                           (local_308[1] * 0x40000000 | local_308[1] >> 0x22) ^
                           (local_308[1] << 0x24 | local_308[1] >> 0x1c));
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    md->state[lVar1] = md->state[lVar1] + local_308[lVar1];
  }
  return 8;
}

Assistant:

static int s_sha512_compress(struct sha512_state * md, const unsigned char *buf)
{
    ulong64 S[8], W[80], t0, t1;
    int i;

    /* copy state into S */
    for (i = 0; i < 8; i++) {
        S[i] = md->state[i];
    }

    /* copy the state into 1024-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD64H(W[i], buf + (8*i));
    }

    /* fill W[16..79] */
    for (i = 16; i < 80; i++) {
        W[i] = Gamma1(W[i - 2]) + W[i - 7] + Gamma0(W[i - 15]) + W[i - 16];
    }

    /* Compress */
#define RND(a,b,c,d,e,f,g,h,i)                         \
     t0 = h + Sigma1(e) + Ch(e, f, g) + K[i] + W[i];   \
     t1 = Sigma0(a) + Maj(a, b, c);                    \
     d += t0;                                          \
     h  = t0 + t1;

    for (i = 0; i < 80; i += 8) {
        RND(S[0],S[1],S[2],S[3],S[4],S[5],S[6],S[7],i+0);
        RND(S[7],S[0],S[1],S[2],S[3],S[4],S[5],S[6],i+1);
        RND(S[6],S[7],S[0],S[1],S[2],S[3],S[4],S[5],i+2);
        RND(S[5],S[6],S[7],S[0],S[1],S[2],S[3],S[4],i+3);
        RND(S[4],S[5],S[6],S[7],S[0],S[1],S[2],S[3],i+4);
        RND(S[3],S[4],S[5],S[6],S[7],S[0],S[1],S[2],i+5);
        RND(S[2],S[3],S[4],S[5],S[6],S[7],S[0],S[1],i+6);
        RND(S[1],S[2],S[3],S[4],S[5],S[6],S[7],S[0],i+7);
    }

    /* feedback */
    for (i = 0; i < 8; i++) {
        md->state[i] = md->state[i] + S[i];
    }

    return 0;
}